

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

void trace_hotside(jit_State *J,BCIns *pc)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  
  if (((J[-1].penalty[0x3c].pc.ptr32 & 0x6000) == 0) &&
     (*(char *)((ulong)J->L->base[-1].u32.lo + 6) == '\0')) {
    lVar2 = *(long *)((ulong)J->trace[J->parent].gcptr32 + 0x20);
    cVar1 = *(char *)(lVar2 + 0xb + (ulong)J->exitno * 0xc);
    if ((cVar1 != -1) &&
       (bVar3 = cVar1 + 1, *(byte *)(lVar2 + (ulong)J->exitno * 0xc + 0xb) = bVar3,
       J->param[7] <= (int)(uint)bVar3)) {
      J->state = LJ_TRACE_START;
      lj_trace_ins(J,pc);
      return;
    }
  }
  return;
}

Assistant:

static void trace_hotside(jit_State *J, const BCIns *pc)
{
  SnapShot *snap = &traceref(J, J->parent)->snap[J->exitno];
  if (!(J2G(J)->hookmask & (HOOK_GC|HOOK_VMEVENT)) &&
      isluafunc(curr_func(J->L)) &&
      snap->count != SNAPCOUNT_DONE &&
      ++snap->count >= J->param[JIT_P_hotexit]) {
    lj_assertJ(J->state == LJ_TRACE_IDLE, "hot side exit while recording");
    /* J->parent is non-zero for a side trace. */
    J->state = LJ_TRACE_START;
    lj_trace_ins(J, pc);
  }
}